

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O0

void __thiscall
soul::heart::Printer::PrinterStream::printEndpointReference
          (PrinterStream *this,EndpointReference *e)

{
  bool bVar1;
  ProcessorInstance *pPVar2;
  CodePrinter *pCVar3;
  unsigned_long *puVar4;
  EndpointReference *e_local;
  PrinterStream *this_local;
  
  bVar1 = pool_ptr<soul::heart::ProcessorInstance>::operator!=(&e->processor,(void *)0x0);
  if (bVar1) {
    pCVar3 = this->out;
    pPVar2 = pool_ptr<soul::heart::ProcessorInstance>::operator->(&e->processor);
    pCVar3 = choc::text::CodePrinter::operator<<(pCVar3,&pPVar2->instanceName);
    choc::text::CodePrinter::operator<<(pCVar3,".");
  }
  choc::text::CodePrinter::operator<<(this->out,&e->endpointName);
  bVar1 = std::optional::operator_cast_to_bool((optional *)&e->endpointIndex);
  if (bVar1) {
    pCVar3 = choc::text::CodePrinter::operator<<(this->out,"[");
    puVar4 = std::optional<unsigned_long>::operator*(&e->endpointIndex);
    pCVar3 = choc::text::CodePrinter::operator<<(pCVar3,*puVar4);
    choc::text::CodePrinter::operator<<(pCVar3,"]");
  }
  return;
}

Assistant:

void printEndpointReference (const heart::EndpointReference& e)
        {
            if (e.processor != nullptr)
                out << e.processor->instanceName << ".";

            out << e.endpointName;

            if (e.endpointIndex)
                out << "[" << *e.endpointIndex << "]";
        }